

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O3

void __thiscall duckdb::QueryProfiler::StartPhase(QueryProfiler *this,MetricsType phase_metric)

{
  iterator __position;
  int iVar1;
  rep rVar2;
  MetricsType local_19;
  
  local_19 = phase_metric;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar1 == 0) {
    if (((this->is_explain_analyze != false) || ((this->context->config).enable_profiler == true))
       && (this->running == true)) {
      __position._M_current =
           (this->phase_stack).
           super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
           super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->phase_stack).
          super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
          super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::MetricsType,std::allocator<duckdb::MetricsType>>::
        _M_realloc_insert<duckdb::MetricsType_const&>
                  ((vector<duckdb::MetricsType,std::allocator<duckdb::MetricsType>> *)
                   &this->phase_stack,__position,&local_19);
      }
      else {
        *__position._M_current = phase_metric;
        (this->phase_stack).super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
        super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      (this->phase_profiler).finished = false;
      rVar2 = ::std::chrono::_V2::steady_clock::now();
      (this->phase_profiler).start.__d.__r = rVar2;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void QueryProfiler::StartPhase(MetricsType phase_metric) {
	lock_guard<std::mutex> guard(lock);
	if (!IsEnabled() || !running) {
		return;
	}

	// start a new phase
	phase_stack.push_back(phase_metric);
	// restart the timer
	phase_profiler.Start();
}